

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

void lanli_buffer_slurp(lanli_buffer *buf,size_t size)

{
  size_t size_local;
  lanli_buffer *buf_local;
  
  if ((buf != (lanli_buffer *)0x0) && (buf->unit != 0)) {
    if (size < buf->size) {
      buf->size = buf->size - size;
      memmove(buf->data,buf->data + size,buf->size);
    }
    else {
      buf->size = 0;
    }
    return;
  }
  __assert_fail("buf && buf->unit",
                "/workspace/llm4binary/github/license_c_cmakelists/hoedown[P]lanli/src/buffer.c",
                0x87,"void lanli_buffer_slurp(lanli_buffer *, size_t)");
}

Assistant:

void lanli_buffer_slurp(lanli_buffer *buf, size_t size) {
  assert(buf && buf->unit);

  if (size >= buf->size) {
    buf->size = 0;
    return;
  }

  buf->size -= size;
  memmove(buf->data, buf->data + size, buf->size);
}